

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O0

void iadst16_low1_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  __m256i in1;
  __m256i in1_00;
  __m256i in1_01;
  __m256i in1_02;
  __m256i in1_03;
  __m256i in1_04;
  __m256i in1_05;
  __m256i in1_06;
  __m256i in0;
  __m256i in0_00;
  __m256i in0_01;
  __m256i in0_02;
  __m256i in0_03;
  __m256i in0_04;
  __m256i in0_05;
  __m256i in0_06;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined8 uVar55;
  undefined8 uVar56;
  undefined8 uVar57;
  uint uVar58;
  int32_t *piVar59;
  int in_ECX;
  uint in_EDX;
  undefined8 *in_RSI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  undefined1 auVar60 [16];
  __m256i clamp_hi_out;
  __m256i clamp_lo_out;
  int log_range_out;
  __m256i temp2;
  __m256i temp1;
  __m256i y;
  __m256i x;
  __m256i v [16];
  __m256i zero;
  __m256i rnding;
  __m256i cospi32;
  __m256i cospi16;
  __m256i cospi48;
  __m256i cospi56;
  __m256i cospi8;
  __m256i cospi62;
  __m256i cospi2;
  int32_t *cospi;
  int local_1bc4;
  int shift;
  undefined1 in_stack_ffffffffffffe4c0 [24];
  undefined4 in_stack_ffffffffffffe4d8;
  undefined8 uVar61;
  undefined8 uVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  longlong lVar65;
  undefined8 uStack_1b08;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined8 local_1a80;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined8 local_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  char local_175c;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 uStack_610;
  undefined8 uStack_608;
  __m256i *local_5e0;
  __m256i *palStack_5d8;
  __m256i *palStack_5d0;
  longlong lStack_5c8;
  __m256i *palStack_588;
  ulong uStack_118;
  ulong uStack_98;
  ulong uStack_78;
  ulong uStack_58;
  
  piVar59 = cospi_arr(in_EDX);
  uVar58 = piVar59[2];
  auVar60 = vpinsrd_avx(ZEXT416(uVar58),uVar58,1);
  auVar60 = vpinsrd_avx(auVar60,uVar58,2);
  auVar60 = vpinsrd_avx(auVar60,uVar58,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar58),uVar58,1);
  auVar1 = vpinsrd_avx(auVar1,uVar58,2);
  auVar1 = vpinsrd_avx(auVar1,uVar58,3);
  uStack_7d0 = auVar1._0_8_;
  uStack_7c8 = auVar1._8_8_;
  uVar58 = piVar59[0x3e];
  auVar1 = vpinsrd_avx(ZEXT416(uVar58),uVar58,1);
  auVar1 = vpinsrd_avx(auVar1,uVar58,2);
  auVar1 = vpinsrd_avx(auVar1,uVar58,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar58),uVar58,1);
  auVar2 = vpinsrd_avx(auVar2,uVar58,2);
  auVar2 = vpinsrd_avx(auVar2,uVar58,3);
  uStack_790 = auVar2._0_8_;
  uStack_788 = auVar2._8_8_;
  uVar58 = piVar59[8];
  auVar2 = vpinsrd_avx(ZEXT416(uVar58),uVar58,1);
  auVar2 = vpinsrd_avx(auVar2,uVar58,2);
  auVar2 = vpinsrd_avx(auVar2,uVar58,3);
  auVar3 = vpinsrd_avx(ZEXT416(uVar58),uVar58,1);
  auVar3 = vpinsrd_avx(auVar3,uVar58,2);
  auVar3 = vpinsrd_avx(auVar3,uVar58,3);
  uStack_750 = auVar3._0_8_;
  uStack_748 = auVar3._8_8_;
  uVar58 = piVar59[0x38];
  auVar3 = vpinsrd_avx(ZEXT416(uVar58),uVar58,1);
  auVar3 = vpinsrd_avx(auVar3,uVar58,2);
  auVar3 = vpinsrd_avx(auVar3,uVar58,3);
  auVar4 = vpinsrd_avx(ZEXT416(uVar58),uVar58,1);
  auVar4 = vpinsrd_avx(auVar4,uVar58,2);
  auVar4 = vpinsrd_avx(auVar4,uVar58,3);
  uStack_710 = auVar4._0_8_;
  uStack_708 = auVar4._8_8_;
  uVar58 = piVar59[0x30];
  auVar4 = vpinsrd_avx(ZEXT416(uVar58),uVar58,1);
  auVar4 = vpinsrd_avx(auVar4,uVar58,2);
  auVar4 = vpinsrd_avx(auVar4,uVar58,3);
  auVar5 = vpinsrd_avx(ZEXT416(uVar58),uVar58,1);
  auVar5 = vpinsrd_avx(auVar5,uVar58,2);
  auVar5 = vpinsrd_avx(auVar5,uVar58,3);
  uStack_6d0 = auVar5._0_8_;
  uStack_6c8 = auVar5._8_8_;
  uVar58 = piVar59[0x10];
  auVar5 = vpinsrd_avx(ZEXT416(uVar58),uVar58,1);
  auVar5 = vpinsrd_avx(auVar5,uVar58,2);
  auVar5 = vpinsrd_avx(auVar5,uVar58,3);
  auVar6 = vpinsrd_avx(ZEXT416(uVar58),uVar58,1);
  auVar6 = vpinsrd_avx(auVar6,uVar58,2);
  auVar6 = vpinsrd_avx(auVar6,uVar58,3);
  uStack_690 = auVar6._0_8_;
  uStack_688 = auVar6._8_8_;
  uVar58 = piVar59[0x20];
  auVar6 = vpinsrd_avx(ZEXT416(uVar58),uVar58,1);
  auVar6 = vpinsrd_avx(auVar6,uVar58,2);
  auVar6 = vpinsrd_avx(auVar6,uVar58,3);
  auVar7 = vpinsrd_avx(ZEXT416(uVar58),uVar58,1);
  auVar7 = vpinsrd_avx(auVar7,uVar58,2);
  auVar7 = vpinsrd_avx(auVar7,uVar58,3);
  uStack_650 = auVar7._0_8_;
  uStack_648 = auVar7._8_8_;
  local_175c = (char)in_EDX;
  uVar58 = 1 << (local_175c - 1U & 0x1f);
  auVar7 = vpinsrd_avx(ZEXT416(uVar58),uVar58,1);
  auVar7 = vpinsrd_avx(auVar7,uVar58,2);
  auVar7 = vpinsrd_avx(auVar7,uVar58,3);
  auVar8 = vpinsrd_avx(ZEXT416(uVar58),uVar58,1);
  auVar8 = vpinsrd_avx(auVar8,uVar58,2);
  auVar8 = vpinsrd_avx(auVar8,uVar58,3);
  uStack_610 = auVar8._0_8_;
  uStack_608 = auVar8._8_8_;
  uStack_58 = SUB328(ZEXT832(0),4);
  auVar38._16_8_ = uStack_790;
  auVar38._0_16_ = auVar1;
  auVar38._24_8_ = uStack_788;
  auVar9 = vpmulld_avx2(*in_RDI,auVar38);
  auVar54._16_8_ = uStack_610;
  auVar54._0_16_ = auVar7;
  auVar54._24_8_ = uStack_608;
  auVar9 = vpaddd_avx2(auVar9,auVar54);
  auVar11 = vpsrad_avx2(auVar9,ZEXT416(in_EDX));
  auVar12._16_8_ = uStack_7d0;
  auVar12._0_16_ = auVar60;
  auVar12._24_8_ = uStack_7c8;
  auVar9 = vpmulld_avx2(*in_RDI,auVar12);
  auVar9 = vpsubd_avx2(ZEXT832(uStack_58) << 0x40,auVar9);
  auVar53._16_8_ = uStack_610;
  auVar53._0_16_ = auVar7;
  auVar53._24_8_ = uStack_608;
  auVar9 = vpaddd_avx2(auVar9,auVar53);
  auVar12 = vpsrad_avx2(auVar9,ZEXT416(in_EDX));
  local_1aa0 = auVar11._0_8_;
  uStack_1a98 = auVar11._8_8_;
  uStack_1a90 = auVar11._16_8_;
  uStack_1a88 = auVar11._24_8_;
  local_1a80 = auVar12._0_8_;
  auVar37._16_8_ = uStack_750;
  auVar37._0_16_ = auVar2;
  auVar37._24_8_ = uStack_748;
  auVar9 = vpmulld_avx2(auVar11,auVar37);
  auVar13._16_8_ = uStack_710;
  auVar13._0_16_ = auVar3;
  auVar13._24_8_ = uStack_708;
  auVar10 = vpmulld_avx2(auVar12,auVar13);
  auVar9 = vpaddd_avx2(auVar9,auVar10);
  auVar52._16_8_ = uStack_610;
  auVar52._0_16_ = auVar7;
  auVar52._24_8_ = uStack_608;
  auVar9 = vpaddd_avx2(auVar9,auVar52);
  auVar13 = vpsrad_avx2(auVar9,ZEXT416(in_EDX));
  auVar36._16_8_ = uStack_710;
  auVar36._0_16_ = auVar3;
  auVar36._24_8_ = uStack_708;
  auVar9 = vpmulld_avx2(auVar11,auVar36);
  auVar14._16_8_ = uStack_750;
  auVar14._0_16_ = auVar2;
  auVar14._24_8_ = uStack_748;
  auVar10 = vpmulld_avx2(auVar12,auVar14);
  auVar9 = vpsubd_avx2(auVar9,auVar10);
  auVar51._16_8_ = uStack_610;
  auVar51._0_16_ = auVar7;
  auVar51._24_8_ = uStack_608;
  auVar9 = vpaddd_avx2(auVar9,auVar51);
  auVar14 = vpsrad_avx2(auVar9,ZEXT416(in_EDX));
  uVar61 = auVar14._0_8_;
  uStack_1b08 = auVar14._24_8_;
  uVar55 = uStack_1b08;
  local_1b00 = auVar13._0_8_;
  uVar56 = local_1b00;
  auVar35._16_8_ = uStack_690;
  auVar35._0_16_ = auVar5;
  auVar35._24_8_ = uStack_688;
  auVar9 = vpmulld_avx2(auVar11,auVar35);
  auVar15._16_8_ = uStack_6d0;
  auVar15._0_16_ = auVar4;
  auVar15._24_8_ = uStack_6c8;
  auVar10 = vpmulld_avx2(auVar12,auVar15);
  auVar9 = vpaddd_avx2(auVar9,auVar10);
  auVar50._16_8_ = uStack_610;
  auVar50._0_16_ = auVar7;
  auVar50._24_8_ = uStack_608;
  auVar9 = vpaddd_avx2(auVar9,auVar50);
  auVar15 = vpsrad_avx2(auVar9,ZEXT416(in_EDX));
  auVar34._16_8_ = uStack_6d0;
  auVar34._0_16_ = auVar4;
  auVar34._24_8_ = uStack_6c8;
  auVar9 = vpmulld_avx2(auVar11,auVar34);
  auVar16._16_8_ = uStack_690;
  auVar16._0_16_ = auVar5;
  auVar16._24_8_ = uStack_688;
  auVar10 = vpmulld_avx2(auVar12,auVar16);
  auVar9 = vpsubd_avx2(auVar9,auVar10);
  auVar49._16_8_ = uStack_610;
  auVar49._0_16_ = auVar7;
  auVar49._24_8_ = uStack_608;
  auVar9 = vpaddd_avx2(auVar9,auVar49);
  auVar16 = vpsrad_avx2(auVar9,ZEXT416(in_EDX));
  uVar62 = auVar16._0_8_;
  uStack_1b08 = auVar16._24_8_;
  local_1b00 = auVar15._0_8_;
  uVar57 = local_1b00;
  auVar33._16_8_ = uStack_690;
  auVar33._0_16_ = auVar5;
  auVar33._24_8_ = uStack_688;
  auVar9 = vpmulld_avx2(auVar13,auVar33);
  auVar32._16_8_ = uStack_6d0;
  auVar32._0_16_ = auVar4;
  auVar32._24_8_ = uStack_6c8;
  auVar10 = vpmulld_avx2(auVar14,auVar32);
  auVar9 = vpaddd_avx2(auVar9,auVar10);
  auVar48._16_8_ = uStack_610;
  auVar48._0_16_ = auVar7;
  auVar48._24_8_ = uStack_608;
  auVar9 = vpaddd_avx2(auVar9,auVar48);
  auVar11 = vpsrad_avx2(auVar9,ZEXT416(in_EDX));
  auVar31._16_8_ = uStack_6d0;
  auVar31._0_16_ = auVar4;
  auVar31._24_8_ = uStack_6c8;
  auVar9 = vpmulld_avx2(auVar13,auVar31);
  auVar17._16_8_ = uStack_690;
  auVar17._0_16_ = auVar5;
  auVar17._24_8_ = uStack_688;
  auVar10 = vpmulld_avx2(auVar14,auVar17);
  auVar9 = vpsubd_avx2(auVar9,auVar10);
  auVar47._16_8_ = uStack_610;
  auVar47._0_16_ = auVar7;
  auVar47._24_8_ = uStack_608;
  auVar9 = vpaddd_avx2(auVar9,auVar47);
  auVar17 = vpsrad_avx2(auVar9,ZEXT416(in_EDX));
  uVar63 = auVar17._0_8_;
  uVar64 = auVar17._8_8_;
  lVar65 = auVar17._16_8_;
  local_1b00 = auVar11._0_8_;
  uStack_1af8 = auVar11._8_8_;
  uStack_1af0 = auVar11._16_8_;
  uStack_1ae8 = auVar11._24_8_;
  auVar30._8_8_ = local_1aa0;
  auVar30._0_8_ = local_1aa0;
  auVar30._16_8_ = local_1aa0;
  auVar30._24_8_ = local_1aa0;
  auVar29._16_8_ = uStack_650;
  auVar29._0_16_ = auVar6;
  auVar29._24_8_ = uStack_648;
  auVar10 = vpmulld_avx2(auVar30,auVar29);
  auVar19._8_8_ = local_1a80;
  auVar19._0_8_ = local_1a80;
  auVar19._16_8_ = local_1a80;
  auVar19._24_8_ = local_1a80;
  auVar18._16_8_ = uStack_650;
  auVar18._0_16_ = auVar6;
  auVar18._24_8_ = uStack_648;
  auVar11 = vpmulld_avx2(auVar19,auVar18);
  auVar9 = vpaddd_avx2(auVar10,auVar11);
  auVar46._16_8_ = uStack_610;
  auVar46._0_16_ = auVar7;
  auVar46._24_8_ = uStack_608;
  auVar9 = vpaddd_avx2(auVar9,auVar46);
  auVar18 = vpsrad_avx2(auVar9,ZEXT416(in_EDX));
  auVar9 = vpsubd_avx2(auVar10,auVar11);
  auVar45._16_8_ = uStack_610;
  auVar45._0_16_ = auVar7;
  auVar45._24_8_ = uStack_608;
  auVar9 = vpaddd_avx2(auVar9,auVar45);
  auVar19 = vpsrad_avx2(auVar9,ZEXT416(in_EDX));
  auVar28._8_8_ = uVar57;
  auVar28._0_8_ = uVar57;
  auVar28._16_8_ = uVar57;
  auVar28._24_8_ = uVar57;
  auVar27._16_8_ = uStack_650;
  auVar27._0_16_ = auVar6;
  auVar27._24_8_ = uStack_648;
  auVar10 = vpmulld_avx2(auVar28,auVar27);
  auVar21._8_8_ = uVar62;
  auVar21._0_8_ = uVar62;
  auVar21._16_8_ = uVar62;
  auVar21._24_8_ = uVar62;
  auVar20._16_8_ = uStack_650;
  auVar20._0_16_ = auVar6;
  auVar20._24_8_ = uStack_648;
  auVar11 = vpmulld_avx2(auVar21,auVar20);
  auVar9 = vpaddd_avx2(auVar10,auVar11);
  auVar44._16_8_ = uStack_610;
  auVar44._0_16_ = auVar7;
  auVar44._24_8_ = uStack_608;
  auVar9 = vpaddd_avx2(auVar9,auVar44);
  auVar20 = vpsrad_avx2(auVar9,ZEXT416(in_EDX));
  auVar9 = vpsubd_avx2(auVar10,auVar11);
  auVar43._16_8_ = uStack_610;
  auVar43._0_16_ = auVar7;
  auVar43._24_8_ = uStack_608;
  auVar9 = vpaddd_avx2(auVar9,auVar43);
  auVar21 = vpsrad_avx2(auVar9,ZEXT416(in_EDX));
  auVar26._8_8_ = uVar56;
  auVar26._0_8_ = uVar56;
  auVar26._16_8_ = uVar56;
  auVar26._24_8_ = uVar56;
  auVar25._16_8_ = uStack_650;
  auVar25._0_16_ = auVar6;
  auVar25._24_8_ = uStack_648;
  auVar10 = vpmulld_avx2(auVar26,auVar25);
  auVar23._8_8_ = uVar61;
  auVar23._0_8_ = uVar61;
  auVar23._16_8_ = uVar61;
  auVar23._24_8_ = uVar61;
  auVar22._16_8_ = uStack_650;
  auVar22._0_16_ = auVar6;
  auVar22._24_8_ = uStack_648;
  auVar11 = vpmulld_avx2(auVar23,auVar22);
  auVar9 = vpaddd_avx2(auVar10,auVar11);
  auVar42._16_8_ = uStack_610;
  auVar42._0_16_ = auVar7;
  auVar42._24_8_ = uStack_608;
  auVar9 = vpaddd_avx2(auVar9,auVar42);
  auVar22 = vpsrad_avx2(auVar9,ZEXT416(in_EDX));
  auVar9 = vpsubd_avx2(auVar10,auVar11);
  auVar41._16_8_ = uStack_610;
  auVar41._0_16_ = auVar7;
  auVar41._24_8_ = uStack_608;
  auVar9 = vpaddd_avx2(auVar9,auVar41);
  auVar23 = vpsrad_avx2(auVar9,ZEXT416(in_EDX));
  auVar24._8_8_ = local_1b00;
  auVar24._0_8_ = local_1b00;
  auVar24._16_8_ = local_1b00;
  auVar24._24_8_ = local_1b00;
  auVar10._16_8_ = uStack_650;
  auVar10._0_16_ = auVar6;
  auVar10._24_8_ = uStack_648;
  auVar10 = vpmulld_avx2(auVar24,auVar10);
  auVar11._8_8_ = uVar63;
  auVar11._0_8_ = uVar63;
  auVar11._16_8_ = uVar63;
  auVar11._24_8_ = uVar63;
  auVar9._16_8_ = uStack_650;
  auVar9._0_16_ = auVar6;
  auVar9._24_8_ = uStack_648;
  auVar11 = vpmulld_avx2(auVar11,auVar9);
  auVar9 = vpaddd_avx2(auVar10,auVar11);
  auVar40._16_8_ = uStack_610;
  auVar40._0_16_ = auVar7;
  auVar40._24_8_ = uStack_608;
  auVar9 = vpaddd_avx2(auVar9,auVar40);
  auVar24 = vpsrad_avx2(auVar9,ZEXT416(in_EDX));
  auVar9 = vpsubd_avx2(auVar10,auVar11);
  auVar39._16_8_ = uStack_610;
  auVar39._0_16_ = auVar7;
  auVar39._24_8_ = uStack_608;
  auVar9 = vpaddd_avx2(auVar9,auVar39);
  auVar9 = vpsrad_avx2(auVar9,ZEXT416(in_EDX));
  if (in_ECX == 0) {
    if (in_R8D + 6 < 0x10) {
      local_1bc4 = 0x10;
    }
    else {
      local_1bc4 = in_R8D + 6;
    }
    uVar58 = -(1 << ((char)local_1bc4 - 1U & 0x1f));
    auVar60 = vpinsrd_avx(ZEXT416(uVar58),uVar58,1);
    auVar60 = vpinsrd_avx(auVar60,uVar58,2);
    auVar60 = vpinsrd_avx(auVar60,uVar58,3);
    auVar1 = vpinsrd_avx(ZEXT416(uVar58),uVar58,1);
    auVar1 = vpinsrd_avx(auVar1,uVar58,2);
    auVar1 = vpinsrd_avx(auVar1,uVar58,3);
    local_5e0 = auVar60._0_8_;
    palStack_5d8 = auVar60._8_8_;
    palStack_5d0 = auVar1._0_8_;
    lStack_5c8 = auVar1._8_8_;
    uVar58 = (1 << ((char)local_1bc4 - 1U & 0x1f)) - 1;
    auVar60 = vpinsrd_avx(ZEXT416(uVar58),uVar58,1);
    auVar60 = vpinsrd_avx(auVar60,uVar58,2);
    auVar60 = vpinsrd_avx(auVar60,uVar58,3);
    auVar1 = vpinsrd_avx(ZEXT416(uVar58),uVar58,1);
    auVar1 = vpinsrd_avx(auVar1,uVar58,2);
    vpinsrd_avx(auVar1,uVar58,3);
    auVar60 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar60;
    palStack_588 = auVar60._8_8_;
    in0[0]._4_4_ = local_1bc4;
    in0[0]._0_4_ = in_stack_ffffffffffffe4d8;
    in0[1] = uVar63;
    in0[2] = uVar64;
    in0[3] = lVar65;
    in1[1] = in_stack_ffffffffffffe4c0._0_8_;
    in1[2] = in_stack_ffffffffffffe4c0._8_8_;
    in1[3] = in_stack_ffffffffffffe4c0._16_8_;
    in1[0] = lStack_5c8;
    shift = auVar60._4_4_;
    neg_shift_avx2(in0,in1,palStack_5d0,palStack_5d8,local_5e0,palStack_588,shift);
    in0_00[0]._4_4_ = local_1bc4;
    in0_00[0]._0_4_ = in_stack_ffffffffffffe4d8;
    in0_00[1] = uVar63;
    in0_00[2] = uVar64;
    in0_00[3] = lVar65;
    in1_00[1] = in_stack_ffffffffffffe4c0._0_8_;
    in1_00[2] = in_stack_ffffffffffffe4c0._8_8_;
    in1_00[3] = in_stack_ffffffffffffe4c0._16_8_;
    in1_00[0] = lStack_5c8;
    neg_shift_avx2(in0_00,in1_00,palStack_5d0,palStack_5d8,local_5e0,palStack_588,shift);
    in0_01[0]._4_4_ = local_1bc4;
    in0_01[0]._0_4_ = in_stack_ffffffffffffe4d8;
    in0_01[1] = uVar63;
    in0_01[2] = uVar64;
    in0_01[3] = lVar65;
    in1_01[1] = in_stack_ffffffffffffe4c0._0_8_;
    in1_01[2] = in_stack_ffffffffffffe4c0._8_8_;
    in1_01[3] = in_stack_ffffffffffffe4c0._16_8_;
    in1_01[0] = lStack_5c8;
    neg_shift_avx2(in0_01,in1_01,palStack_5d0,palStack_5d8,local_5e0,palStack_588,shift);
    in0_02[0]._4_4_ = local_1bc4;
    in0_02[0]._0_4_ = in_stack_ffffffffffffe4d8;
    in0_02[1] = uVar63;
    in0_02[2] = uVar64;
    in0_02[3] = lVar65;
    in1_02[1] = in_stack_ffffffffffffe4c0._0_8_;
    in1_02[2] = in_stack_ffffffffffffe4c0._8_8_;
    in1_02[3] = in_stack_ffffffffffffe4c0._16_8_;
    in1_02[0] = lStack_5c8;
    neg_shift_avx2(in0_02,in1_02,palStack_5d0,palStack_5d8,local_5e0,palStack_588,shift);
    in0_03[0]._4_4_ = local_1bc4;
    in0_03[0]._0_4_ = in_stack_ffffffffffffe4d8;
    in0_03[1] = uVar63;
    in0_03[2] = uVar64;
    in0_03[3] = lVar65;
    in1_03[1] = in_stack_ffffffffffffe4c0._0_8_;
    in1_03[2] = in_stack_ffffffffffffe4c0._8_8_;
    in1_03[3] = in_stack_ffffffffffffe4c0._16_8_;
    in1_03[0] = lStack_5c8;
    neg_shift_avx2(in0_03,in1_03,palStack_5d0,palStack_5d8,local_5e0,palStack_588,shift);
    in0_04[0]._4_4_ = local_1bc4;
    in0_04[0]._0_4_ = in_stack_ffffffffffffe4d8;
    in0_04[1] = uVar63;
    in0_04[2] = uVar64;
    in0_04[3] = lVar65;
    in1_04[1] = in_stack_ffffffffffffe4c0._0_8_;
    in1_04[2] = in_stack_ffffffffffffe4c0._8_8_;
    in1_04[3] = in_stack_ffffffffffffe4c0._16_8_;
    in1_04[0] = lStack_5c8;
    neg_shift_avx2(in0_04,in1_04,palStack_5d0,palStack_5d8,local_5e0,palStack_588,shift);
    in0_05[0]._4_4_ = local_1bc4;
    in0_05[0]._0_4_ = in_stack_ffffffffffffe4d8;
    in0_05[1] = uVar63;
    in0_05[2] = uVar64;
    in0_05[3] = lVar65;
    in1_05[1] = in_stack_ffffffffffffe4c0._0_8_;
    in1_05[2] = in_stack_ffffffffffffe4c0._8_8_;
    in1_05[3] = in_stack_ffffffffffffe4c0._16_8_;
    in1_05[0] = lStack_5c8;
    neg_shift_avx2(in0_05,in1_05,palStack_5d0,palStack_5d8,local_5e0,palStack_588,shift);
    in0_06[0]._4_4_ = local_1bc4;
    in0_06[0]._0_4_ = in_stack_ffffffffffffe4d8;
    in0_06[1] = uVar63;
    in0_06[2] = uVar64;
    in0_06[3] = lVar65;
    in1_06[1] = in_stack_ffffffffffffe4c0._0_8_;
    in1_06[2] = in_stack_ffffffffffffe4c0._8_8_;
    in1_06[3] = in_stack_ffffffffffffe4c0._16_8_;
    in1_06[0] = lStack_5c8;
    neg_shift_avx2(in0_06,in1_06,palStack_5d0,palStack_5d8,local_5e0,palStack_588,shift);
  }
  else {
    *in_RSI = local_1aa0;
    in_RSI[1] = uStack_1a98;
    in_RSI[2] = uStack_1a90;
    in_RSI[3] = uStack_1a88;
    uStack_78 = SUB328(ZEXT832(0),4);
    auVar10 = vpsubd_avx2(ZEXT832(uStack_78) << 0x40,auVar13);
    *(undefined1 (*) [32])(in_RSI + 4) = auVar10;
    in_RSI[8] = local_1b00;
    in_RSI[9] = uStack_1af8;
    in_RSI[10] = uStack_1af0;
    in_RSI[0xb] = uStack_1ae8;
    uStack_98 = SUB328(ZEXT832(0),4);
    auVar10 = vpsubd_avx2(ZEXT832(uStack_98) << 0x40,auVar15);
    *(undefined1 (*) [32])(in_RSI + 0xc) = auVar10;
    local_19e0 = auVar20._0_8_;
    uStack_19d8 = auVar20._8_8_;
    uStack_19d0 = auVar20._16_8_;
    uStack_19c8 = auVar20._24_8_;
    in_RSI[0x10] = local_19e0;
    in_RSI[0x11] = uStack_19d8;
    in_RSI[0x12] = uStack_19d0;
    in_RSI[0x13] = uStack_19c8;
    auVar10 = vpsubd_avx2(ZEXT832(uStack_98) << 0x40,auVar24);
    *(undefined1 (*) [32])(in_RSI + 0x14) = auVar10;
    local_1960 = auVar22._0_8_;
    uStack_1958 = auVar22._8_8_;
    uStack_1950 = auVar22._16_8_;
    uStack_1948 = auVar22._24_8_;
    in_RSI[0x18] = local_1960;
    in_RSI[0x19] = uStack_1958;
    in_RSI[0x1a] = uStack_1950;
    in_RSI[0x1b] = uStack_1948;
    auVar10 = vpsubd_avx2(ZEXT832(uStack_98) << 0x40,auVar18);
    *(undefined1 (*) [32])(in_RSI + 0x1c) = auVar10;
    local_1a40 = auVar19._0_8_;
    uStack_1a38 = auVar19._8_8_;
    uStack_1a30 = auVar19._16_8_;
    uStack_1a28 = auVar19._24_8_;
    in_RSI[0x20] = local_1a40;
    in_RSI[0x21] = uStack_1a38;
    in_RSI[0x22] = uStack_1a30;
    in_RSI[0x23] = uStack_1a28;
    auVar10 = vpsubd_avx2(ZEXT832(uStack_98) << 0x40,auVar23);
    *(undefined1 (*) [32])(in_RSI + 0x24) = auVar10;
    local_18c0 = auVar9._0_8_;
    uStack_18b8 = auVar9._8_8_;
    uStack_18b0 = auVar9._16_8_;
    uStack_18a8 = auVar9._24_8_;
    in_RSI[0x28] = local_18c0;
    in_RSI[0x29] = uStack_18b8;
    in_RSI[0x2a] = uStack_18b0;
    in_RSI[0x2b] = uStack_18a8;
    uStack_118 = SUB328(ZEXT832(0),4);
    auVar9 = vpsubd_avx2(ZEXT832(uStack_118) << 0x40,auVar21);
    *(undefined1 (*) [32])(in_RSI + 0x2c) = auVar9;
    in_RSI[0x30] = uVar62;
    in_RSI[0x31] = auVar16._8_8_;
    in_RSI[0x32] = auVar16._16_8_;
    in_RSI[0x33] = uStack_1b08;
    auVar9 = vpsubd_avx2(ZEXT832(uStack_118) << 0x40,auVar17);
    *(undefined1 (*) [32])(in_RSI + 0x34) = auVar9;
    in_RSI[0x38] = uVar61;
    in_RSI[0x39] = auVar14._8_8_;
    in_RSI[0x3a] = auVar14._16_8_;
    in_RSI[0x3b] = uVar55;
    auVar9 = vpsubd_avx2(ZEXT832(uStack_118) << 0x40,auVar12);
    *(undefined1 (*) [32])(in_RSI + 0x3c) = auVar9;
  }
  return;
}

Assistant:

static void iadst16_low1_avx2(__m256i *in, __m256i *out, int bit, int do_cols,
                              int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m256i cospi2 = _mm256_set1_epi32(cospi[2]);
  const __m256i cospi62 = _mm256_set1_epi32(cospi[62]);
  const __m256i cospi8 = _mm256_set1_epi32(cospi[8]);
  const __m256i cospi56 = _mm256_set1_epi32(cospi[56]);
  const __m256i cospi48 = _mm256_set1_epi32(cospi[48]);
  const __m256i cospi16 = _mm256_set1_epi32(cospi[16]);
  const __m256i cospi32 = _mm256_set1_epi32(cospi[32]);
  const __m256i rnding = _mm256_set1_epi32(1 << (bit - 1));
  const __m256i zero = _mm256_setzero_si256();
  __m256i v[16], x, y, temp1, temp2;

  // Calculate the column 0, 1, 2, 3
  {
    // stage 0
    // stage 1
    // stage 2
    x = _mm256_mullo_epi32(in[0], cospi62);
    v[0] = _mm256_add_epi32(x, rnding);
    v[0] = _mm256_srai_epi32(v[0], bit);

    x = _mm256_mullo_epi32(in[0], cospi2);
    v[1] = _mm256_sub_epi32(zero, x);
    v[1] = _mm256_add_epi32(v[1], rnding);
    v[1] = _mm256_srai_epi32(v[1], bit);

    // stage 3
    v[8] = v[0];
    v[9] = v[1];

    // stage 4
    temp1 = _mm256_mullo_epi32(v[8], cospi8);
    x = _mm256_mullo_epi32(v[9], cospi56);
    temp1 = _mm256_add_epi32(temp1, x);
    temp1 = _mm256_add_epi32(temp1, rnding);
    temp1 = _mm256_srai_epi32(temp1, bit);

    temp2 = _mm256_mullo_epi32(v[8], cospi56);
    x = _mm256_mullo_epi32(v[9], cospi8);
    temp2 = _mm256_sub_epi32(temp2, x);
    temp2 = _mm256_add_epi32(temp2, rnding);
    temp2 = _mm256_srai_epi32(temp2, bit);
    v[8] = temp1;
    v[9] = temp2;

    // stage 5
    v[4] = v[0];
    v[5] = v[1];
    v[12] = v[8];
    v[13] = v[9];

    // stage 6
    temp1 = _mm256_mullo_epi32(v[4], cospi16);
    x = _mm256_mullo_epi32(v[5], cospi48);
    temp1 = _mm256_add_epi32(temp1, x);
    temp1 = _mm256_add_epi32(temp1, rnding);
    temp1 = _mm256_srai_epi32(temp1, bit);

    temp2 = _mm256_mullo_epi32(v[4], cospi48);
    x = _mm256_mullo_epi32(v[5], cospi16);
    temp2 = _mm256_sub_epi32(temp2, x);
    temp2 = _mm256_add_epi32(temp2, rnding);
    temp2 = _mm256_srai_epi32(temp2, bit);
    v[4] = temp1;
    v[5] = temp2;

    temp1 = _mm256_mullo_epi32(v[12], cospi16);
    x = _mm256_mullo_epi32(v[13], cospi48);
    temp1 = _mm256_add_epi32(temp1, x);
    temp1 = _mm256_add_epi32(temp1, rnding);
    temp1 = _mm256_srai_epi32(temp1, bit);

    temp2 = _mm256_mullo_epi32(v[12], cospi48);
    x = _mm256_mullo_epi32(v[13], cospi16);
    temp2 = _mm256_sub_epi32(temp2, x);
    temp2 = _mm256_add_epi32(temp2, rnding);
    temp2 = _mm256_srai_epi32(temp2, bit);
    v[12] = temp1;
    v[13] = temp2;

    // stage 7
    v[2] = v[0];
    v[3] = v[1];
    v[6] = v[4];
    v[7] = v[5];
    v[10] = v[8];
    v[11] = v[9];
    v[14] = v[12];
    v[15] = v[13];

    // stage 8
    y = _mm256_mullo_epi32(v[2], cospi32);
    x = _mm256_mullo_epi32(v[3], cospi32);
    v[2] = _mm256_add_epi32(y, x);
    v[2] = _mm256_add_epi32(v[2], rnding);
    v[2] = _mm256_srai_epi32(v[2], bit);

    v[3] = _mm256_sub_epi32(y, x);
    v[3] = _mm256_add_epi32(v[3], rnding);
    v[3] = _mm256_srai_epi32(v[3], bit);

    y = _mm256_mullo_epi32(v[6], cospi32);
    x = _mm256_mullo_epi32(v[7], cospi32);
    v[6] = _mm256_add_epi32(y, x);
    v[6] = _mm256_add_epi32(v[6], rnding);
    v[6] = _mm256_srai_epi32(v[6], bit);

    v[7] = _mm256_sub_epi32(y, x);
    v[7] = _mm256_add_epi32(v[7], rnding);
    v[7] = _mm256_srai_epi32(v[7], bit);

    y = _mm256_mullo_epi32(v[10], cospi32);
    x = _mm256_mullo_epi32(v[11], cospi32);
    v[10] = _mm256_add_epi32(y, x);
    v[10] = _mm256_add_epi32(v[10], rnding);
    v[10] = _mm256_srai_epi32(v[10], bit);

    v[11] = _mm256_sub_epi32(y, x);
    v[11] = _mm256_add_epi32(v[11], rnding);
    v[11] = _mm256_srai_epi32(v[11], bit);

    y = _mm256_mullo_epi32(v[14], cospi32);
    x = _mm256_mullo_epi32(v[15], cospi32);
    v[14] = _mm256_add_epi32(y, x);
    v[14] = _mm256_add_epi32(v[14], rnding);
    v[14] = _mm256_srai_epi32(v[14], bit);

    v[15] = _mm256_sub_epi32(y, x);
    v[15] = _mm256_add_epi32(v[15], rnding);
    v[15] = _mm256_srai_epi32(v[15], bit);

    // stage 9
    if (do_cols) {
      out[0] = v[0];
      out[1] = _mm256_sub_epi32(_mm256_setzero_si256(), v[8]);
      out[2] = v[12];
      out[3] = _mm256_sub_epi32(_mm256_setzero_si256(), v[4]);
      out[4] = v[6];
      out[5] = _mm256_sub_epi32(_mm256_setzero_si256(), v[14]);
      out[6] = v[10];
      out[7] = _mm256_sub_epi32(_mm256_setzero_si256(), v[2]);
      out[8] = v[3];
      out[9] = _mm256_sub_epi32(_mm256_setzero_si256(), v[11]);
      out[10] = v[15];
      out[11] = _mm256_sub_epi32(_mm256_setzero_si256(), v[7]);
      out[12] = v[5];
      out[13] = _mm256_sub_epi32(_mm256_setzero_si256(), v[13]);
      out[14] = v[9];
      out[15] = _mm256_sub_epi32(_mm256_setzero_si256(), v[1]);
    } else {
      const int log_range_out = AOMMAX(16, bd + 6);
      const __m256i clamp_lo_out =
          _mm256_set1_epi32(-(1 << (log_range_out - 1)));
      const __m256i clamp_hi_out =
          _mm256_set1_epi32((1 << (log_range_out - 1)) - 1);

      neg_shift_avx2(v[0], v[8], out + 0, out + 1, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
      neg_shift_avx2(v[12], v[4], out + 2, out + 3, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
      neg_shift_avx2(v[6], v[14], out + 4, out + 5, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
      neg_shift_avx2(v[10], v[2], out + 6, out + 7, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
      neg_shift_avx2(v[3], v[11], out + 8, out + 9, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
      neg_shift_avx2(v[15], v[7], out + 10, out + 11, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
      neg_shift_avx2(v[5], v[13], out + 12, out + 13, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
      neg_shift_avx2(v[9], v[1], out + 14, out + 15, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    }
  }
}